

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cpp
# Opt level: O2

void __thiscall Arena::Arena(Arena *this,Map *map,int time,int block)

{
  TimeEvent *this_00;
  
  (this->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spawns).super__Vector_base<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->map = map;
  this->time = time;
  this->block = block;
  this->occupants = 0;
  this_00 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(this_00,arena_spawn,this,(double)time,-1);
  this->spawn_timer = this_00;
  Timer::Register(&this->map->world->timer,this_00);
  return;
}

Assistant:

Arena::Arena(Map *map, int time, int block)
{
	this->map = map;
	this->time = time;
	this->block = block;
	this->occupants = 0;

	this->spawn_timer = new TimeEvent(arena_spawn, this, time, Timer::FOREVER);
	this->map->world->timer.Register(this->spawn_timer);
}